

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O0

void __thiscall xercesc_4_0::ReaderMgr::cleanStackBackTo(ReaderMgr *this,XMLSize_t readerNum)

{
  bool bVar1;
  XMLSize_t XVar2;
  RuntimeException *this_00;
  ReaderData *pRVar3;
  XMLReader *pXVar4;
  void *p;
  XMLSize_t readerNum_local;
  ReaderMgr *this_local;
  
  p = (void *)readerNum;
  while( true ) {
    XVar2 = XMLReader::getReaderNum(this->fCurReader);
    if (XVar2 == readerNum) {
      return;
    }
    bVar1 = RefStackOf<xercesc_4_0::ReaderMgr::ReaderData>::empty(this->fReaderStack);
    if (bVar1) break;
    pRVar3 = this->fCurReaderData;
    if (pRVar3 != (ReaderData *)0x0) {
      ReaderData::~ReaderData(pRVar3);
      XMemory::operator_delete((XMemory *)pRVar3,p);
    }
    pRVar3 = RefStackOf<xercesc_4_0::ReaderMgr::ReaderData>::pop(this->fReaderStack);
    this->fCurReaderData = pRVar3;
    pXVar4 = ReaderData::getReader(this->fCurReaderData);
    this->fCurReader = pXVar4;
  }
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
  RuntimeException::RuntimeException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ReaderMgr.cpp"
             ,0x196,RdrMgr_ReaderIdNotFound,this->fMemoryManager);
  __cxa_throw(this_00,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
}

Assistant:

void ReaderMgr::cleanStackBackTo(const XMLSize_t readerNum)
{
    //
    //  Just start popping readers until we find the one with the indicated
    //  reader number.
    //
    while (true)
    {
        if (fCurReader->getReaderNum() == readerNum)
            break;

        if (fReaderStack->empty())
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::RdrMgr_ReaderIdNotFound, fMemoryManager);

        delete fCurReaderData;
        fCurReaderData = fReaderStack->pop();
        fCurReader = fCurReaderData->getReader ();
    }
}